

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::
bindProcessName<Catch::ConfigData,std::__cxx11::string>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          field)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  long *plVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__IArgFunction_0018d1f0;
  plVar2[1] = field;
  pIVar3 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  pIVar3->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0018d1f0;
  pIVar3[1]._vptr_IArgFunction = (_func_int **)field;
  pIVar1 = (this->m_boundProcessName).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
  }
  (this->m_boundProcessName).functionObj = pIVar3;
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void bindProcessName( M C::* field ) {
            m_boundProcessName = new Detail::BoundDataMember<C,M>( field );
        }